

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_umin64_m68k(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    uVar3 = *(ulong *)((long)b + uVar2);
    if (*(ulong *)((long)a + uVar2) < *(ulong *)((long)b + uVar2)) {
      uVar3 = *(ulong *)((long)a + uVar2);
    }
    *(ulong *)((long)d + uVar2) = uVar3;
    uVar2 = uVar2 + 8;
  } while (uVar2 < uVar1 + 8);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_umin64_m68k_cold_1();
  return;
}

Assistant:

void HELPER(gvec_umin64)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint64_t)) {
        uint64_t aa = *(uint64_t *)((char *)a + i);
        uint64_t bb = *(uint64_t *)((char *)b + i);
        uint64_t dd = aa < bb ? aa : bb;
        *(uint64_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}